

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O2

double fpdf(double x,int num,int den)

{
  char *__format;
  double dVar1;
  double dVar2;
  double x_00;
  double dVar3;
  double dVar4;
  double local_10;
  
  if ((num < 1) || (den < 1)) {
    __format = "Degrees Of Freedom should be real integers";
  }
  else {
    if (0.0 <= x) {
      dVar2 = (double)num;
      dVar4 = (double)den;
      dVar1 = x * dVar2;
      if (dVar1 <= dVar4) {
        dVar3 = dVar1 + dVar4;
        x_00 = dVar1 / dVar3;
        local_10 = (dVar3 * dVar2 - dVar2 * dVar1) / (dVar3 * dVar3);
        dVar1 = dVar2;
      }
      else {
        dVar1 = dVar1 + dVar4;
        x_00 = dVar4 / dVar1;
        local_10 = (dVar2 * dVar4) / (dVar1 * dVar1);
        dVar1 = dVar4;
        dVar4 = dVar2;
      }
      dVar4 = betapdf(x_00,dVar1 * 0.5,dVar4 * 0.5);
      return dVar4 * local_10;
    }
    __format = "The range of distribution only takes non-negative and real values";
  }
  printf(__format);
  exit(1);
}

Assistant:

double fpdf(double x, int num,int den) {
	double oup,k1,k2,y,z;
	
	if (num <= 0 || den <= 0) {
		printf("Degrees Of Freedom should be real integers");
		exit(1);
	}
	
	if (x < 0.) {
		printf("The range of distribution only takes non-negative and real values");
		exit(1);
	}
	
	k1 = (double) num;
	k2 = (double) den;
	
	if ( k1 * x > k2 ) {
		y = (k2 * k1) / ((k2 + k1 * x) * (k2 + k1 * x)) ;
		oup = y * betapdf(k2 / (k2 + k1 * x), k2 / 2.,k1 / 2.);
	} else {
		z = k2 + k1 * x;
		y = (z * k1 - x * k1 * k1) / (pow(z,2.0));
		oup = y * betapdf(k1 * x / (k2 + k1 * x), k1 / 2.,k2 / 2.);
	}
	
	return oup;
}